

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O2

fields absl::lts_20250127::time_internal::cctz::detail::impl::n_min
                 (year_t y,diff_t m,diff_t d,diff_t hh,diff_t ch,diff_t mm,second_t ss)

{
  long lVar1;
  char mm_00;
  long lVar2;
  fields fVar3;
  
  lVar1 = mm % 0x3c;
  lVar2 = mm / 0x3c + (lVar1 >> 0x3f) + ch;
  mm_00 = (char)lVar1 + '<';
  if (-1 < lVar1) {
    mm_00 = (char)lVar1;
  }
  fVar3 = n_hour(y,m,d,hh / 0x18 + lVar2 / 0x18,hh % 0x18 + lVar2 % 0x18,mm_00,ss);
  fVar3._8_8_ = fVar3._8_8_ & 0xffffffffff;
  return fVar3;
}

Assistant:

CONSTEXPR_F fields n_min(year_t y, diff_t m, diff_t d, diff_t hh, diff_t ch,
                         diff_t mm, second_t ss) noexcept {
  ch += mm / 60;
  mm %= 60;
  if (mm < 0) {
    ch -= 1;
    mm += 60;
  }
  return n_hour(y, m, d, hh / 24 + ch / 24, hh % 24 + ch % 24,
                static_cast<minute_t>(mm), ss);
}